

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O1

int up_scale_image(uchar *orig,int width,int height,int channels,uchar *resampled,
                  int resampled_width,int resampled_height)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  iVar6 = 0;
  iVar5 = 0;
  if ((((resampled != (uchar *)0x0) && (iVar5 = 0, orig != (uchar *)0x0)) &&
      (iVar5 = iVar6, 0 < channels)) &&
     (((0 < width && (0 < height)) && ((1 < resampled_width && (1 < resampled_height)))))) {
    uVar7 = (ulong)(uint)channels;
    uVar8 = 0;
    do {
      fVar11 = (float)(int)uVar8 * (((float)height + -1.0) / ((float)resampled_height + -1.0));
      iVar5 = (int)fVar11;
      if (height + -2 < iVar5) {
        iVar5 = height + -2;
      }
      fVar11 = fVar11 - (float)iVar5;
      uVar9 = 0;
      do {
        fVar12 = (float)(int)uVar9 * (((float)width + -1.0) / ((float)resampled_width + -1.0));
        iVar6 = (int)fVar12;
        if (width + -2 < iVar6) {
          iVar6 = width + -2;
        }
        fVar12 = fVar12 - (float)iVar6;
        lVar4 = (long)((iVar6 + iVar5 * width) * channels);
        uVar10 = 0;
        do {
          pbVar1 = orig + lVar4;
          lVar3 = lVar4 + uVar7;
          lVar2 = lVar4 + channels * width;
          lVar4 = lVar4 + 1;
          resampled[uVar10 + (long)(((int)uVar8 * resampled_width + (int)uVar9) * channels)] =
               (uchar)(int)((float)orig[lVar2 + uVar7] * fVar12 * fVar11 +
                           (float)orig[lVar2] * (1.0 - fVar12) * fVar11 +
                           (float)orig[lVar3] * fVar12 * (1.0 - fVar11) +
                           (float)*pbVar1 * (1.0 - fVar12) * (1.0 - fVar11) + 0.5);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar7);
        uVar9 = uVar9 + 1;
      } while (uVar9 != (uint)resampled_width);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)resampled_height);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int
	up_scale_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int resampled_width, int resampled_height
	)
{
	float dx, dy;
	int x, y, c;

    /* error(s) check	*/
    if ( 	(width < 1) || (height < 1) ||
            (resampled_width < 2) || (resampled_height < 2) ||
            (channels < 1) ||
            (NULL == orig) || (NULL == resampled) )
    {
        /*	signify badness	*/
        return 0;
    }
    /*
		for each given pixel in the new map, find the exact location
		from the original map which would contribute to this guy
	*/
    dx = (width - 1.0f) / (resampled_width - 1.0f);
    dy = (height - 1.0f) / (resampled_height - 1.0f);
    for ( y = 0; y < resampled_height; ++y )
    {
    	/* find the base y index and fractional offset from that	*/
    	float sampley = y * dy;
    	int inty = (int)sampley;
    	/*	if( inty < 0 ) { inty = 0; } else	*/
		if( inty > height - 2 ) { inty = height - 2; }
		sampley -= inty;
        for ( x = 0; x < resampled_width; ++x )
        {
			float samplex = x * dx;
			int intx = (int)samplex;
			int base_index;
			/* find the base x index and fractional offset from that	*/
			/*	if( intx < 0 ) { intx = 0; } else	*/
			if( intx > width - 2 ) { intx = width - 2; }
			samplex -= intx;
			/*	base index into the original image	*/
			base_index = (inty * width + intx) * channels;
            for ( c = 0; c < channels; ++c )
            {
            	/*	do the sampling	*/
				float value = 0.5f;
				value += orig[base_index]
							*(1.0f-samplex)*(1.0f-sampley);
				value += orig[base_index+channels]
							*(samplex)*(1.0f-sampley);
				value += orig[base_index+width*channels]
							*(1.0f-samplex)*(sampley);
				value += orig[base_index+width*channels+channels]
							*(samplex)*(sampley);
				/*	move to the next channel	*/
				++base_index;
            	/*	save the new value	*/
            	resampled[y*resampled_width*channels+x*channels+c] =
						(unsigned char)(value);
            }
        }
    }
    /*	done	*/
    return 1;
}